

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O3

void __thiscall soul::HTMLGenerator::printModule(HTMLGenerator *this,HTMLElement *parent,Module *m)

{
  pointer pHVar1;
  HTMLElement *pHVar2;
  HTMLElement *pHVar3;
  char *in_R8;
  HTMLElement *this_00;
  string_view value;
  string_view value_00;
  string_view classToUse;
  string_view text;
  string_view text_00;
  string_view classToUse_00;
  string_view text_01;
  string_view value_01;
  string_view classType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pHVar2 = choc::html::HTMLElement::addDiv(parent);
  value._M_str = "module";
  value._M_len = 6;
  pHVar2 = choc::html::HTMLElement::setClass(pHVar2,value);
  value_00._M_str = (m->UID)._M_dataplus._M_p;
  value_00._M_len = (m->UID)._M_string_length;
  pHVar2 = choc::html::HTMLElement::setID(pHVar2,value_00);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"h2","");
  std::vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>>::
  emplace_back<std::__cxx11::string>
            ((vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>> *)
             &pHVar2->children,&local_48);
  pHVar1 = (pHVar2->children).
           super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  this_00 = pHVar1 + -1;
  classToUse._M_str = "module_type";
  classToUse._M_len = 0xb;
  pHVar3 = choc::html::HTMLElement::addSpan(this_00,classToUse);
  text._M_str = (m->moduleTypeDescription)._M_dataplus._M_p;
  text._M_len = (m->moduleTypeDescription)._M_string_length;
  pHVar3 = choc::html::HTMLElement::addContent(pHVar3,text);
  text_00._M_str = " ";
  text_00._M_len = 1;
  choc::html::HTMLElement::addContent(pHVar3,text_00);
  classToUse_00._M_str = "module_name";
  classToUse_00._M_len = 0xb;
  pHVar3 = choc::html::HTMLElement::addSpan(this_00,classToUse_00);
  text_01._M_str = (m->fullyQualifiedName)._M_dataplus._M_p;
  text_01._M_len = (m->fullyQualifiedName)._M_string_length;
  choc::html::HTMLElement::addContent(pHVar3,text_01);
  classType._M_str = in_R8;
  classType._M_len = (size_t)"summary";
  addComment((HTMLGenerator *)pHVar2,(HTMLElement *)&m->comment,(Comment *)0x7,classType);
  pHVar2 = choc::html::HTMLElement::addDiv(pHVar2);
  value_01._M_str = "module_sections";
  value_01._M_len = 0xf;
  pHVar2 = choc::html::HTMLElement::setClass(pHVar2,value_01);
  printAnnotation(this,pHVar2,&m->annotation);
  printSpecialisationParams(this,pHVar2,m);
  printEndpoints(this,pHVar2,m);
  printStructs(this,pHVar2,m);
  printFunctions(this,pHVar2,m);
  printVariables(this,pHVar2,m);
  printProcessorInstances(this,pHVar2,m);
  printConnections(this,pHVar2,m);
  return;
}

Assistant:

void printModule (choc::html::HTMLElement& parent, const SourceCodeModel::Module& m)
    {
        auto& moduleDiv = parent.addDiv ("module").setID (m.UID);

        auto& title = moduleDiv.addChild ("h2");
        title.addSpan ("module_type").addContent (m.moduleTypeDescription).addContent (" ");
        title.addSpan ("module_name").addContent (m.fullyQualifiedName);

        addComment (moduleDiv, m.comment, "summary");

        auto& sections = moduleDiv.addDiv ("module_sections");
        printAnnotation (sections, m.annotation);
        printSpecialisationParams (sections, m);
        printEndpoints (sections, m);
        printStructs (sections, m);
        printFunctions (sections, m);
        printVariables (sections, m);
        printProcessorInstances (sections, m);
        printConnections (sections, m);
    }